

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

PNode * commit_tree(Parser *p,PNode *pn)

{
  uint32 *puVar1;
  VecPNode *v;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  PNode **ppPVar6;
  D_ReductionCode p_Var7;
  bool bVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  D_ParseNode *pDVar13;
  PNode *pPVar14;
  uint uVar15;
  long lVar16;
  PNode *pPVar17;
  PNode *pn_00;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  PNode *_t;
  PNode *pPVar21;
  int iVar22;
  PNode *_t_1;
  bool bVar23;
  uint local_70 [2];
  D_ParseNode **local_68;
  D_ParseNode *local_60 [3];
  ulong local_48;
  PNode **local_40;
  PNode *local_38;
  
  pPVar21 = pn->latest;
  pPVar14 = pPVar21->latest;
  pPVar17 = pPVar21;
  if (pPVar21 != pPVar21->latest) {
    do {
      pPVar21 = pPVar14;
      pPVar21->refcount = pPVar21->refcount + 1;
      puVar1 = &pPVar17->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(p,pPVar17);
      }
      pn->latest = pPVar21;
      pPVar14 = pPVar21->latest;
      pPVar17 = pPVar21;
    } while (pPVar21 != pPVar21->latest);
  }
  if (pPVar21->evaluated == '\0') {
    pcVar4 = (pPVar21->parse_node).start_loc.s;
    pcVar5 = (pPVar21->parse_node).end;
    if (((pcVar4 != pcVar5) || (pPVar21->reduction == (D_Reduction *)0x0)) ||
       (pPVar21->reduction->final_code == (D_ReductionCode)0x0)) {
      pPVar21->evaluated = '\x01';
    }
    pPVar14 = pPVar21->ambiguities;
    if (pPVar14 != (PNode *)0x0) {
      local_70[0] = 0;
      local_68 = (D_ParseNode **)0x0;
      if (pcVar4 == pcVar5) {
        iVar10 = final_actionless(pPVar21);
        bVar23 = iVar10 != 0;
      }
      else {
        bVar23 = false;
      }
      local_70[0] = 1;
      local_68 = local_60;
      local_60[0] = &pPVar21->parse_node;
      do {
        pPVar21 = pPVar14->latest;
        pPVar17 = pPVar21->latest;
        pn_00 = pPVar21;
        if (pPVar21 != pPVar21->latest) {
          do {
            pPVar21 = pPVar17;
            pPVar21->refcount = pPVar21->refcount + 1;
            puVar1 = &pn_00->refcount;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              free_PNode(p,pn_00);
            }
            pPVar14->latest = pPVar21;
            pPVar17 = pPVar21->latest;
            pn_00 = pPVar21;
          } while (pPVar21 != pPVar21->latest);
        }
        if (((!(bool)((p->user).dont_merge_epsilon_trees == 0 & bVar23)) ||
            ((pPVar21->parse_node).start_loc.s != (pPVar21->parse_node).end)) ||
           (iVar10 = final_actionless(pPVar21), iVar10 == 0)) {
          uVar12 = (ulong)local_70[0];
          if (uVar12 != 0) {
            uVar18 = 0;
            bVar8 = false;
            do {
              if (local_68[uVar18] == &pPVar21->parse_node) {
                bVar8 = true;
              }
              uVar18 = uVar18 + 1;
            } while (uVar12 != uVar18);
            if (bVar8) goto LAB_001446a5;
          }
          if (local_68 == (D_ParseNode **)0x0) {
            local_70[0] = local_70[0] + 1;
            local_60[uVar12] = &pPVar21->parse_node;
            local_68 = local_60;
          }
          else {
            if (local_68 == local_60) {
              if (2 < local_70[0]) goto LAB_00144694;
            }
            else if ((local_70[0] & 7) == 0) {
LAB_00144694:
              vec_add_internal(local_70,&pPVar21->parse_node);
              goto LAB_001446a5;
            }
            local_70[0] = local_70[0] + 1;
            local_68[uVar12] = &pPVar21->parse_node;
          }
        }
LAB_001446a5:
        pPVar14 = pPVar21->ambiguities;
      } while (pPVar14 != (PNode *)0x0);
      if (local_70[0] == 1) {
        pDVar13 = *local_68;
      }
      else {
        pDVar13 = (*(p->user).ambiguity_fn)(&p->user,local_70[0],local_68);
      }
      if (local_68 != local_60 && local_68 != (D_ParseNode **)0x0) {
        free(local_68);
      }
      pPVar21 = (PNode *)(pDVar13 + -2);
      if (pDVar13 == (D_ParseNode *)0x0) {
        pPVar21 = (PNode *)0x0;
      }
    }
    if (pPVar21 == (PNode *)0x0) {
LAB_001449bd:
      pPVar21 = (PNode *)0x0;
    }
    else {
      uVar11 = p->t->symbols[(pPVar21->parse_node).symbol].kind & 0xfffffffe;
      iVar10 = (p->user).dont_fixup_internal_productions;
      uVar15 = (pPVar21->children).n;
      if (uVar15 != 0) {
        v = &pPVar21->children;
        iVar2 = (p->user).fixup_EBNF_productions;
        local_40 = (pPVar21->children).e;
        uVar19 = 0;
        do {
          pPVar14 = commit_tree(p,(pPVar21->children).v[uVar19]);
          if (pPVar14 == (PNode *)0x0) {
            iVar22 = 1;
          }
          else {
            pPVar17 = (pPVar21->children).v[uVar19];
            if (pPVar14 != pPVar17) {
              pPVar14->refcount = pPVar14->refcount + 1;
              puVar1 = &pPVar17->refcount;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                free_PNode(p,pPVar17);
              }
              (pPVar21->children).v[uVar19] = pPVar14;
            }
            iVar22 = 0;
            if (uVar11 == 2 && iVar10 == 0) {
              uVar15 = p->t->symbols[((pPVar21->children).v[uVar19]->parse_node).symbol].kind;
              if (iVar2 != 0) {
                uVar15 = uVar15 & 0xfffffffe;
              }
              if (uVar15 == 2) {
                lVar16 = (long)(int)uVar19;
                pPVar14 = (pPVar21->children).v[lVar16];
                local_48 = (ulong)(pPVar14->children).n;
                uVar3 = (pPVar21->children).n;
                lVar20 = (long)(int)uVar3;
                if (pPVar14 == pPVar21) {
                  d_fail("circular parse: unable to fixup internal symbol");
                }
                if (local_48 == 1) {
                  pPVar17 = *(pPVar14->children).v;
                  puVar1 = &pPVar17->refcount;
                  *puVar1 = *puVar1 + 1;
                  (pPVar21->children).v[lVar16] = pPVar17;
                }
                else {
                  iVar22 = (int)local_48;
                  if (iVar22 == 0) {
                    if ((int)uVar19 < (int)(lVar20 + -1)) {
                      do {
                        ppPVar6 = (pPVar21->children).v;
                        ppPVar6[lVar16] = ppPVar6[lVar16 + 1];
                        lVar16 = lVar16 + 1;
                      } while (lVar20 + -1 != lVar16);
                    }
                    v->n = v->n - 1;
                  }
                  else {
                    uVar12 = local_48;
                    local_38 = pPVar14;
                    if (1 < iVar22) {
                      iVar22 = iVar22 + -1;
                      do {
                        ppPVar6 = (pPVar21->children).v;
                        if (ppPVar6 == (PNode **)0x0) {
                          (pPVar21->children).v = local_40;
                          uVar15 = (pPVar21->children).n;
                          (pPVar21->children).n = uVar15 + 1;
                          (pPVar21->children).e[uVar15] = (PNode *)0x0;
                        }
                        else {
                          uVar15 = v->n;
                          if (ppPVar6 == local_40) {
                            if (2 < uVar15) goto LAB_001448cf;
                          }
                          else if ((uVar15 & 7) == 0) {
LAB_001448cf:
                            vec_add_internal(v,(void *)0x0);
                            uVar12 = local_48;
                            goto LAB_001448e0;
                          }
                          v->n = uVar15 + 1;
                          ppPVar6[uVar15] = (PNode *)0x0;
                        }
LAB_001448e0:
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    if ((int)(uVar19 + 1) < (int)uVar3) {
                      iVar22 = (int)uVar12 + uVar3 + -2;
                      do {
                        ppPVar6 = (pPVar21->children).v;
                        lVar9 = lVar20 + -1;
                        lVar20 = lVar20 + -1;
                        ppPVar6[iVar22] = ppPVar6[lVar9];
                        iVar22 = iVar22 + -1;
                      } while ((int)(uVar19 + 1) < lVar20);
                    }
                    pPVar14 = local_38;
                    if (0 < (int)uVar12) {
                      uVar18 = 0;
                      do {
                        pPVar17 = (local_38->children).v[uVar18];
                        puVar1 = &pPVar17->refcount;
                        *puVar1 = *puVar1 + 1;
                        (pPVar21->children).v[lVar16 + uVar18] = pPVar17;
                        uVar18 = uVar18 + 1;
                      } while (uVar12 != uVar18);
                    }
                  }
                }
                puVar1 = &pPVar14->refcount;
                *puVar1 = *puVar1 - 1;
                if (*puVar1 == 0) {
                  free_PNode(p,pPVar14);
                }
                uVar19 = uVar19 - 1;
                iVar22 = 0xc;
              }
            }
          }
          if ((iVar22 != 0xc) && (iVar22 != 0)) goto LAB_001449bd;
          uVar19 = uVar19 + 1;
          uVar15 = v->n;
        } while (uVar19 < uVar15);
      }
      if ((pPVar21->reduction != (D_Reduction *)0x0) &&
         (p_Var7 = pPVar21->reduction->final_code, p_Var7 != (D_ReductionCode)0x0)) {
        (*p_Var7)(pPVar21,(pPVar21->children).v,uVar15,0x90,&p->user);
      }
      if (((pPVar21->evaluated != '\0') && ((p->user).save_parse_tree == 0)) && (uVar11 != 2)) {
        free_ParseTreeBelow(p,pPVar21);
      }
    }
  }
  return pPVar21;
}

Assistant:

static PNode *commit_tree(Parser *p, PNode *pn) {
  uint i, fixup_ebnf = 0, fixup = 0, internal = 0;
  LATEST(p, pn);
  if (pn->evaluated) return pn;
  if (!is_unreduced_epsilon_PNode(pn)) pn->evaluated = 1;
  if (pn->ambiguities) pn = resolve_ambiguities(p, pn);
  if (!pn) return NULL;
  fixup_ebnf = p->user.fixup_EBNF_productions;
  internal = is_symbol_internal_or_EBNF(p, pn);
  fixup = !p->user.dont_fixup_internal_productions && internal;
  for (i = 0; i < pn->children.n; i++) {
    PNode *tpn = commit_tree(p, pn->children.v[i]);
    if (!tpn) return NULL;
    if (tpn != pn->children.v[i]) {
      ref_pn(tpn);
      unref_pn(p, pn->children.v[i]);
      pn->children.v[i] = tpn;
    }
    if (fixup &&
        (fixup_ebnf ? is_symbol_internal_or_EBNF(p, pn->children.v[i]) : is_symbol_internal(p, pn->children.v[i]))) {
      fixup_internal_symbol(p, pn, i);
      i -= 1;
      continue;
    }
  }
  if (pn->reduction) DBG(printf("commit %p (%s)\n", (void *)pn, p->t->symbols[pn->parse_node.symbol].name));
  if (pn->reduction && pn->reduction->final_code) {
    void **v0 = pn->children.v == NULL ?  NULL : (void **)&pn->children.v[0];
    pn->reduction->final_code(pn, v0, pn->children.n, (intptr_t)(sizeof(PNode) - sizeof(D_ParseNode)),
                              (D_Parser *)p);
  }
  if (pn->evaluated) {
    if (!p->user.save_parse_tree && !internal) free_ParseTreeBelow(p, pn);
  }
  return pn;
}